

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O2

settings_pack * libtorrent::default_settings(void)

{
  settings_pack *in_RDI;
  string *psVar1;
  int *piVar2;
  undefined *puVar3;
  int i;
  long lVar4;
  string local_40;
  
  (in_RDI->super_settings_interface)._vptr_settings_interface = (_func_int **)&PTR_set_str_004ce1b0;
  (in_RDI->m_strings).
  super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->m_strings).
  super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->m_strings).
  super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->m_ints).
  super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->m_ints).
  super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->m_ints).
  super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->m_bools).
  super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->m_bools).
  super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->m_bools).
  super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar1 = (string *)&DAT_004d8910;
  for (lVar4 = 0; lVar4 != 0xd; lVar4 = lVar4 + 1) {
    if (*(long *)(psVar1 + 8) != 0) {
      ::std::__cxx11::string::string((string *)&local_40,psVar1);
      settings_pack::set_str(in_RDI,(int)lVar4,&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
    }
    psVar1 = psVar1 + 0x38;
  }
  piVar2 = (int *)&DAT_004ce218;
  for (lVar4 = 0; lVar4 != 0x9f; lVar4 = lVar4 + 1) {
    settings_pack::set_int(in_RDI,(uint)lVar4 | 0x4000,*piVar2);
    piVar2 = piVar2 + 8;
  }
  puVar3 = &DAT_004cf5f8;
  for (lVar4 = 0; lVar4 != 0x54; lVar4 = lVar4 + 1) {
    settings_pack::set_bool(in_RDI,(uint)lVar4 | 0x8000,(bool)*puVar3);
    puVar3 = puVar3 + 0x20;
  }
  return in_RDI;
}

Assistant:

settings_pack default_settings()
	{
		settings_pack ret;
		// TODO: it would be nice to reserve() these vectors up front
		for (int i = 0; i < settings_pack::num_string_settings; ++i)
		{
			if (str_settings[i].default_value.empty()) continue;
			ret.set_str(settings_pack::string_type_base + i, str_settings[i].default_value);
		}

		for (int i = 0; i < settings_pack::num_int_settings; ++i)
		{
			ret.set_int(settings_pack::int_type_base + i, int_settings[i].default_value);
		}

		for (int i = 0; i < settings_pack::num_bool_settings; ++i)
		{
			ret.set_bool(settings_pack::bool_type_base + i, bool_settings[i].default_value);
		}
		return ret;
	}